

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O3

bool __thiscall
json::LoadObject::process<std::vector<obj_array_var1*,std::allocator<obj_array_var1*>>>
          (LoadObject *this,char *name,
          vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_> *value)

{
  ulong uVar1;
  prop_map *papVar2;
  pointer ppoVar3;
  pointer ppoVar4;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  
  iVar6 = strcmp(this->_prev_name,name);
  if (-1 < iVar6) {
    __assert_fail("false && \"variables should be serialized in alphabetical order\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/yak32[P]glw_json/tests/../glw_json.h"
                  ,0x10c,
                  "bool json::LoadObject::process(const char *, V &) [V = std::vector<obj_array_var1 *>]"
                 );
  }
  this->_prev_name = name;
  uVar8 = this->props_size;
  uVar1 = this->current;
  if (uVar1 < uVar8) {
    papVar2 = this->props;
    iVar6 = strncmp(name,(*papVar2)[uVar1].param.str,(*papVar2)[uVar1].param.len);
    if (iVar6 == 0) {
      pcVar7 = load_container<std::vector<obj_array_var1*,std::allocator<obj_array_var1*>>>
                         ((*papVar2)[uVar1].value.str,(*papVar2)[uVar1].value.len,value,
                          this->options);
      sVar5 = this->current;
      if (pcVar7 == (*this->props)[sVar5].value.str + (*this->props)[sVar5].value.len) {
        this->current = sVar5 + 1;
        return true;
      }
      this->error_pos = pcVar7;
      uVar8 = this->props_size;
      goto LAB_00154d04;
    }
  }
  if ((this->options & 2U) == 0) {
    if ((this->options & 1U) == 0) {
      return true;
    }
    ppoVar3 = (value->super__Vector_base<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppoVar4 = (value->super__Vector_base<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->super__Vector_base<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (value->super__Vector_base<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (value->super__Vector_base<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppoVar3 == (pointer)0x0) {
      return true;
    }
    operator_delete(ppoVar3,(long)ppoVar4 - (long)ppoVar3);
    return true;
  }
LAB_00154d04:
  this->current = uVar8;
  return false;
}

Assistant:

bool process(const char* name, V& value) {
#ifndef NDEBUG
		// this check could fail if name is dynamically allocated and was freed after usage
		// if Sublime Text 3 is used, select everything inside serialize() and press F9
		if (strcmp(_prev_name, name) >= 0)
			assert(false && "variables should be serialized in alphabetical order");
		_prev_name = name;
#endif
		if (current < props_size &&
			strncmp(name, props[current].param.str, props[current].param.len) == 0) {
			const char* end =
				load(props[current].value.str, props[current].value.len, value, options);
			if (end == props[current].value.str + props[current].value.len) {
				++current;
				return true;
			}
			error_pos = end;
		}
		else if (!(options & ERROR_IF_ABSENT)) {
			if (options & RESET_IF_ABSENT)
				value = V();
			return true;
		}
		current = props_size; // skip parsing
		return false;
	}